

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O0

void trico_decompress_double_precision(uint32_t *number_of_doubles,double **out,uint8_t *compressed)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  size_t num;
  size_t num_00;
  uint64_t hash1_mask_00;
  uint64_t hash2_mask_00;
  void *ptr;
  void *ptr_00;
  double *pdVar6;
  uint64_t *puVar7;
  byte *pbVar8;
  int local_fc;
  int j_3;
  int iStack_f0;
  uint8_t b_1;
  int j_2;
  int max_j;
  int j_1;
  uint uStack_e0;
  uint8_t b;
  int j;
  uint32_t q;
  uint32_t cnt;
  uint64_t *p_out;
  uint64_t last_value;
  uint64_t stride;
  uint64_t prediction2;
  uint64_t hash2;
  uint64_t prediction1;
  uint64_t hash1;
  uint64_t value;
  uint64_t xor [2];
  uint64_t bcode [2];
  uint64_t bc;
  uint64_t *hash_table_2;
  uint64_t *hash_table_1;
  uint64_t hash2_mask;
  uint64_t hash1_mask;
  uint64_t hash2_size;
  uint64_t hash1_size;
  uint64_t hash2_size_exponent;
  uint64_t hash1_size_exponent;
  byte *pbStack_20;
  uint8_t hash_info;
  uint8_t *compressed_local;
  double **out_local;
  uint32_t *number_of_doubles_local;
  
  iVar4 = ((int)(uint)*compressed >> 4) << 1;
  iVar5 = (*compressed & 0xf) << 1;
  num = 1L << (sbyte)iVar4;
  num_00 = 1L << (sbyte)iVar5;
  hash1_mask_00 = num - 1;
  hash2_mask_00 = num_00 - 1;
  ptr = trico_calloc(num,8);
  ptr_00 = trico_calloc(num_00,8);
  *number_of_doubles = (uint)compressed[1] << 0x18;
  *number_of_doubles = (uint)compressed[2] << 0x10 | *number_of_doubles;
  *number_of_doubles = (uint)compressed[3] << 8 | *number_of_doubles;
  pbStack_20 = compressed + 5;
  *number_of_doubles = (uint)compressed[4] | *number_of_doubles;
  pdVar6 = (double *)trico_malloc((ulong)*number_of_doubles << 3);
  *out = pdVar6;
  prediction1 = 0;
  hash2 = 0;
  prediction2 = 0;
  stride = 0;
  p_out = (uint64_t *)0x0;
  _q = *out;
  uVar2 = *number_of_doubles;
  for (uStack_e0 = 0; uStack_e0 < uVar2 >> 1; uStack_e0 = uStack_e0 + 1) {
    bVar1 = *pbStack_20;
    pbStack_20 = pbStack_20 + 1;
    for (j_1 = 0; j_1 < 2; j_1 = j_1 + 1) {
      bVar3 = bVar1 >> (((byte)j_1 & 0xf) << 2) & 0xf;
      xor[(long)j_1 + 1] = (ulong)bVar3;
      switch(bVar3) {
      case 0:
        xor[(long)j_1 + -1] = 0;
        break;
      case 1:
        xor[(long)j_1 + -1] = (ulong)*pbStack_20;
        pbStack_20 = pbStack_20 + 1;
        break;
      case 2:
        xor[(long)j_1 + -1] = (ulong)*pbStack_20 << 8;
        xor[(long)j_1 + -1] = (ulong)pbStack_20[1] | xor[(long)j_1 + -1];
        pbStack_20 = pbStack_20 + 2;
        break;
      case 3:
        xor[(long)j_1 + -1] = (ulong)*pbStack_20 << 0x10;
        xor[(long)j_1 + -1] = (ulong)pbStack_20[1] << 8 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[2] | xor[(long)j_1 + -1];
        pbStack_20 = pbStack_20 + 3;
        break;
      case 4:
        xor[(long)j_1 + -1] = (ulong)*pbStack_20 << 0x18;
        xor[(long)j_1 + -1] = (ulong)pbStack_20[1] << 0x10 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[2] << 8 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[3] | xor[(long)j_1 + -1];
        pbStack_20 = pbStack_20 + 4;
        break;
      case 5:
        xor[(long)j_1 + -1] = (ulong)*pbStack_20 << 0x20;
        xor[(long)j_1 + -1] = (ulong)pbStack_20[1] << 0x18 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[2] << 0x10 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[3] << 8 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[4] | xor[(long)j_1 + -1];
        pbStack_20 = pbStack_20 + 5;
        break;
      case 6:
        xor[(long)j_1 + -1] = (ulong)*pbStack_20 << 0x28;
        xor[(long)j_1 + -1] = (ulong)pbStack_20[1] << 0x20 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[2] << 0x18 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[3] << 0x10 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[4] << 8 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[5] | xor[(long)j_1 + -1];
        pbStack_20 = pbStack_20 + 6;
        break;
      case 7:
        xor[(long)j_1 + -1] = (ulong)*pbStack_20 << 0x30;
        xor[(long)j_1 + -1] = (ulong)pbStack_20[1] << 0x28 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[2] << 0x20 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[3] << 0x18 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[4] << 0x10 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[5] << 8 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[6] | xor[(long)j_1 + -1];
        pbStack_20 = pbStack_20 + 7;
        break;
      case 8:
        xor[(long)j_1 + -1] = (ulong)*pbStack_20 << 0x38;
        xor[(long)j_1 + -1] = (ulong)pbStack_20[1] << 0x30 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[2] << 0x28 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[3] << 0x20 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[4] << 0x18 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[5] << 0x10 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[6] << 8 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[7] | xor[(long)j_1 + -1];
        pbStack_20 = pbStack_20 + 8;
        break;
      case 9:
        xor[(long)j_1 + -1] = (ulong)*pbStack_20;
        pbStack_20 = pbStack_20 + 1;
        break;
      case 10:
        xor[(long)j_1 + -1] = (ulong)*pbStack_20 << 8;
        xor[(long)j_1 + -1] = (ulong)pbStack_20[1] | xor[(long)j_1 + -1];
        pbStack_20 = pbStack_20 + 2;
        break;
      case 0xb:
        xor[(long)j_1 + -1] = (ulong)*pbStack_20 << 0x10;
        xor[(long)j_1 + -1] = (ulong)pbStack_20[1] << 8 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[2] | xor[(long)j_1 + -1];
        pbStack_20 = pbStack_20 + 3;
        break;
      case 0xc:
        xor[(long)j_1 + -1] = (ulong)*pbStack_20 << 0x18;
        xor[(long)j_1 + -1] = (ulong)pbStack_20[1] << 0x10 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[2] << 8 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[3] | xor[(long)j_1 + -1];
        pbStack_20 = pbStack_20 + 4;
        break;
      case 0xd:
        xor[(long)j_1 + -1] = (ulong)*pbStack_20 << 0x20;
        xor[(long)j_1 + -1] = (ulong)pbStack_20[1] << 0x18 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[2] << 0x10 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[3] << 8 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[4] | xor[(long)j_1 + -1];
        pbStack_20 = pbStack_20 + 5;
        break;
      case 0xe:
        xor[(long)j_1 + -1] = (ulong)*pbStack_20 << 0x28;
        xor[(long)j_1 + -1] = (ulong)pbStack_20[1] << 0x20 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[2] << 0x18 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[3] << 0x10 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[4] << 8 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[5] | xor[(long)j_1 + -1];
        pbStack_20 = pbStack_20 + 6;
        break;
      case 0xf:
        xor[(long)j_1 + -1] = (ulong)*pbStack_20 << 0x30;
        xor[(long)j_1 + -1] = (ulong)pbStack_20[1] << 0x28 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[2] << 0x20 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[3] << 0x18 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[4] << 0x10 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[5] << 8 | xor[(long)j_1 + -1];
        xor[(long)j_1 + -1] = (ulong)pbStack_20[6] | xor[(long)j_1 + -1];
        pbStack_20 = pbStack_20 + 7;
      }
    }
    for (j_2 = 0; j_2 < 2; j_2 = j_2 + 1) {
      if (8 < xor[(long)j_2 + 1]) {
        hash2 = stride;
      }
      puVar7 = (uint64_t *)(xor[(long)j_2 + -1] ^ hash2);
      *(uint64_t **)((long)ptr + prediction1 * 8) = puVar7;
      prediction1 = trico_compute_hash1_64(prediction1,(uint64_t)puVar7,(long)iVar4,hash1_mask_00);
      hash2 = *(uint64_t *)((long)ptr + prediction1 * 8);
      *(long *)((long)ptr_00 + prediction2 * 8) = (long)puVar7 - (long)p_out;
      prediction2 = trico_compute_hash2_64
                              (prediction2,(long)puVar7 - (long)p_out,(long)iVar5,hash2_mask_00);
      stride = (long)puVar7 + *(long *)((long)ptr_00 + prediction2 * 8);
      *_q = (double)puVar7;
      _q = _q + 1;
      p_out = puVar7;
    }
  }
  if ((*number_of_doubles & 1) != 0) {
    bVar1 = *pbStack_20;
    iStack_f0 = 2;
    pbStack_20 = pbStack_20 + 1;
    for (j_3 = 0; j_3 < iStack_f0; j_3 = j_3 + 1) {
      bVar3 = bVar1 >> (((byte)j_3 & 0xf) << 2) & 0xf;
      xor[(long)j_3 + 1] = (ulong)bVar3;
      switch(bVar3) {
      case 0:
        xor[(long)j_3 + -1] = 0;
        break;
      case 1:
        pbVar8 = pbStack_20 + 1;
        xor[(long)j_3 + -1] = (ulong)*pbStack_20;
        pbStack_20 = pbVar8;
        if (xor[(long)j_3 + -1] == 0) {
          iStack_f0 = j_3;
        }
        break;
      case 2:
        xor[(long)j_3 + -1] = (ulong)*pbStack_20 << 8;
        xor[(long)j_3 + -1] = (ulong)pbStack_20[1] | xor[(long)j_3 + -1];
        pbStack_20 = pbStack_20 + 2;
        break;
      case 3:
        xor[(long)j_3 + -1] = (ulong)*pbStack_20 << 0x10;
        xor[(long)j_3 + -1] = (ulong)pbStack_20[1] << 8 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[2] | xor[(long)j_3 + -1];
        pbStack_20 = pbStack_20 + 3;
        break;
      case 4:
        xor[(long)j_3 + -1] = (ulong)*pbStack_20 << 0x18;
        xor[(long)j_3 + -1] = (ulong)pbStack_20[1] << 0x10 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[2] << 8 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[3] | xor[(long)j_3 + -1];
        pbStack_20 = pbStack_20 + 4;
        break;
      case 5:
        xor[(long)j_3 + -1] = (ulong)*pbStack_20 << 0x20;
        xor[(long)j_3 + -1] = (ulong)pbStack_20[1] << 0x18 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[2] << 0x10 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[3] << 8 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[4] | xor[(long)j_3 + -1];
        pbStack_20 = pbStack_20 + 5;
        break;
      case 6:
        xor[(long)j_3 + -1] = (ulong)*pbStack_20 << 0x28;
        xor[(long)j_3 + -1] = (ulong)pbStack_20[1] << 0x20 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[2] << 0x18 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[3] << 0x10 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[4] << 8 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[5] | xor[(long)j_3 + -1];
        pbStack_20 = pbStack_20 + 6;
        break;
      case 7:
        xor[(long)j_3 + -1] = (ulong)*pbStack_20 << 0x30;
        xor[(long)j_3 + -1] = (ulong)pbStack_20[1] << 0x28 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[2] << 0x20 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[3] << 0x18 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[4] << 0x10 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[5] << 8 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[6] | xor[(long)j_3 + -1];
        pbStack_20 = pbStack_20 + 7;
        break;
      case 8:
        xor[(long)j_3 + -1] = (ulong)*pbStack_20 << 0x38;
        xor[(long)j_3 + -1] = (ulong)pbStack_20[1] << 0x30 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[2] << 0x28 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[3] << 0x20 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[4] << 0x18 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[5] << 0x10 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[6] << 8 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[7] | xor[(long)j_3 + -1];
        pbStack_20 = pbStack_20 + 8;
        break;
      case 9:
        xor[(long)j_3 + -1] = (ulong)*pbStack_20;
        pbStack_20 = pbStack_20 + 1;
        break;
      case 10:
        xor[(long)j_3 + -1] = (ulong)*pbStack_20 << 8;
        xor[(long)j_3 + -1] = (ulong)pbStack_20[1] | xor[(long)j_3 + -1];
        pbStack_20 = pbStack_20 + 2;
        break;
      case 0xb:
        xor[(long)j_3 + -1] = (ulong)*pbStack_20 << 0x10;
        xor[(long)j_3 + -1] = (ulong)pbStack_20[1] << 8 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[2] | xor[(long)j_3 + -1];
        pbStack_20 = pbStack_20 + 3;
        break;
      case 0xc:
        xor[(long)j_3 + -1] = (ulong)*pbStack_20 << 0x18;
        xor[(long)j_3 + -1] = (ulong)pbStack_20[1] << 0x10 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[2] << 8 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[3] | xor[(long)j_3 + -1];
        pbStack_20 = pbStack_20 + 4;
        break;
      case 0xd:
        xor[(long)j_3 + -1] = (ulong)*pbStack_20 << 0x20;
        xor[(long)j_3 + -1] = (ulong)pbStack_20[1] << 0x18 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[2] << 0x10 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[3] << 8 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[4] | xor[(long)j_3 + -1];
        pbStack_20 = pbStack_20 + 5;
        break;
      case 0xe:
        xor[(long)j_3 + -1] = (ulong)*pbStack_20 << 0x28;
        xor[(long)j_3 + -1] = (ulong)pbStack_20[1] << 0x20 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[2] << 0x18 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[3] << 0x10 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[4] << 8 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[5] | xor[(long)j_3 + -1];
        pbStack_20 = pbStack_20 + 6;
        break;
      case 0xf:
        xor[(long)j_3 + -1] = (ulong)*pbStack_20 << 0x30;
        xor[(long)j_3 + -1] = (ulong)pbStack_20[1] << 0x28 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[2] << 0x20 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[3] << 0x18 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[4] << 0x10 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[5] << 8 | xor[(long)j_3 + -1];
        xor[(long)j_3 + -1] = (ulong)pbStack_20[6] | xor[(long)j_3 + -1];
        pbStack_20 = pbStack_20 + 7;
      }
    }
    for (local_fc = 0; local_fc < iStack_f0; local_fc = local_fc + 1) {
      if (8 < xor[(long)local_fc + 1]) {
        hash2 = stride;
      }
      puVar7 = (uint64_t *)(xor[(long)local_fc + -1] ^ hash2);
      *(uint64_t **)((long)ptr + prediction1 * 8) = puVar7;
      prediction1 = trico_compute_hash1_64(prediction1,(uint64_t)puVar7,(long)iVar4,hash1_mask_00);
      hash2 = *(uint64_t *)((long)ptr + prediction1 * 8);
      *(long *)((long)ptr_00 + prediction2 * 8) = (long)puVar7 - (long)p_out;
      prediction2 = trico_compute_hash2_64
                              (prediction2,(long)puVar7 - (long)p_out,(long)iVar5,hash2_mask_00);
      stride = (long)puVar7 + *(long *)((long)ptr_00 + prediction2 * 8);
      *_q = (double)puVar7;
      _q = _q + 1;
      p_out = puVar7;
    }
  }
  trico_free(ptr);
  trico_free(ptr_00);
  return;
}

Assistant:

void trico_decompress_double_precision(uint32_t* number_of_doubles, double** out, const uint8_t* compressed)
  {
  uint8_t hash_info = *compressed++;

  uint64_t hash1_size_exponent = (hash_info >> 4) << 1;
  uint64_t hash2_size_exponent = (hash_info & 15) << 1;

  const uint64_t hash1_size = (uint64_t)1 << hash1_size_exponent;
  const uint64_t hash2_size = (uint64_t)1 << hash2_size_exponent;
  const uint64_t hash1_mask = hash1_size - 1;
  const uint64_t hash2_mask = hash2_size - 1;

  uint64_t* hash_table_1 = (uint64_t*)trico_calloc(hash1_size, 8);
  uint64_t* hash_table_2 = (uint64_t*)trico_calloc(hash2_size, 8);

  *number_of_doubles = ((uint32_t)(*compressed++)) << 24;
  *number_of_doubles |= ((uint32_t)(*compressed++)) << 16;
  *number_of_doubles |= ((uint32_t)(*compressed++)) << 8;
  *number_of_doubles |= ((uint32_t)(*compressed++));
  *out = (double*)trico_malloc(*number_of_doubles * sizeof(double));

  uint64_t bc;
  uint64_t bcode[2];
  uint64_t xor[2];
  uint64_t value;
  uint64_t hash1 = 0;
  uint64_t prediction1 = 0;
  uint64_t hash2 = 0;
  uint64_t prediction2 = 0;
  uint64_t stride;
  uint64_t last_value = 0;
  uint64_t* p_out = (uint64_t*)(*out);

  const uint32_t cnt = *number_of_doubles / 2;
  for (uint32_t q = 0; q < cnt; ++q)
    {
    bc = ((uint32_t)(*compressed++));
    for (int j = 0; j < 2; ++j)
      {
      uint8_t b = (bc >> (j * 4)) & 15;
      bcode[j] = b;
      switch (b)
        {
        case 0:
        {
        xor[j] = 0;
        break;
        }
        case 1:
        {
        xor[j] = ((uint64_t)(*compressed++));
        break;
        }
        case 2:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 3:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 4:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 5:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 6:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 7:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 8:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 56;
        xor[j] |= ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 9:
        {
        xor[j] = ((uint64_t)(*compressed++));
        break;
        }
        case 10:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 11:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 12:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 13:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 14:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 15:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        }
      }
    for (int j = 0; j < 2; ++j)
      {
      if (bcode[j] > 8)
        prediction1 = prediction2;

      value = xor[j] ^ prediction1;

      hash_table_1[hash1] = value;
      hash1 = trico_compute_hash1_64(hash1, value, hash1_size_exponent, hash1_mask);
      prediction1 = hash_table_1[hash1];

      stride = value - last_value;
      hash_table_2[hash2] = stride;
      hash2 = trico_compute_hash2_64(hash2, stride, hash2_size_exponent, hash2_mask);
      prediction2 = value + hash_table_2[hash2];
      last_value = value;

      *p_out++ = value;
      }
    }

  if (*number_of_doubles & 1)
    {
    bc = ((uint32_t)(*compressed++));
    int max_j = 2;
    for (int j = 0; j < max_j; ++j)
      {
      uint8_t b = (bc >> (j * 4)) & 15;
      bcode[j] = b;
      switch (b)
        {
        case 0:
        {
        xor[j] = 0;
        break;
        }
        case 1:
        {
        xor[j] = ((uint64_t)(*compressed++));
        if (xor[j] == 0)
          max_j = j;
        break;
        }
        case 2:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 3:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 4:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 5:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 6:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 7:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 8:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 56;
        xor[j] |= ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 9:
        {
        xor[j] = ((uint64_t)(*compressed++));
        break;
        }
        case 10:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 11:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 12:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 13:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 14:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 15:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        }
      }
    for (int j = 0; j < max_j; ++j)
      {
      if (bcode[j] > 8)
        prediction1 = prediction2;

      value = xor[j] ^ prediction1;

      hash_table_1[hash1] = value;
      hash1 = trico_compute_hash1_64(hash1, value, hash1_size_exponent, hash1_mask);
      prediction1 = hash_table_1[hash1];

      stride = value - last_value;
      hash_table_2[hash2] = stride;
      hash2 = trico_compute_hash2_64(hash2, stride, hash2_size_exponent, hash2_mask);
      prediction2 = value + hash_table_2[hash2];
      last_value = value;

      *p_out++ = value;
      }
    }

  trico_free(hash_table_1);
  trico_free(hash_table_2);
  }